

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

bool mightBeRichTextImpl<QLatin1String>(QLatin1String text)

{
  QLatin1StringView other;
  QLatin1StringView other_00;
  QStringView element;
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  QStringView *this;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype close;
  qsizetype open;
  qsizetype start;
  QChar current;
  QVarLengthArray<char16_t,_256LL> tag;
  QLatin1String *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  char16_t *in_stack_fffffffffffffc78;
  char16_t *str;
  QVarLengthArray<char16_t,_256LL> *in_stack_fffffffffffffc80;
  undefined5 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8d;
  undefined1 in_stack_fffffffffffffc8e;
  bool bVar4;
  undefined1 in_stack_fffffffffffffc8f;
  qsizetype in_stack_fffffffffffffc90;
  long lVar5;
  undefined6 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9e;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffffc9f;
  bool local_351;
  QChar in_stack_fffffffffffffcbe;
  bool local_331;
  bool local_319;
  long local_310;
  long local_300;
  long local_2c8;
  bool local_2b9;
  char16_t local_2a8 [10];
  QChar local_294;
  QChar local_292;
  QChar local_290;
  undefined2 local_28e;
  QChar local_28c;
  undefined1 local_28a;
  char local_289;
  QLatin1StringView local_288;
  QLatin1StringView local_278;
  undefined1 local_266;
  char local_265;
  undefined1 local_264;
  char local_263;
  undefined1 local_262;
  char local_261;
  QLatin1StringView local_260;
  undefined1 local_24c;
  char local_24b;
  undefined1 local_24a;
  char local_249;
  QLatin1StringView local_248;
  QLatin1String local_230;
  QVarLengthArray<char16_t,_256LL> local_220;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QLatin1String::isEmpty((QLatin1String *)0x7bd035);
  if (bVar1) {
    local_2b9 = false;
  }
  else {
    local_2c8 = 0;
    while( true ) {
      qVar3 = QLatin1String::size(&local_230);
      local_319 = false;
      if (local_2c8 < qVar3) {
        QLatin1String::at((QLatin1String *)
                          CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                          (qsizetype)in_stack_fffffffffffffc68);
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                   (QLatin1Char)(char)((ulong)in_stack_fffffffffffffc78 >> 0x38));
        local_319 = QChar::isSpace((QChar *)0x7bd0bf);
      }
      if (local_319 == false) break;
      local_2c8 = local_2c8 + 1;
    }
    local_248 = QLatin1String::mid((QLatin1String *)
                                   CONCAT17(in_stack_fffffffffffffc8f,
                                            CONCAT16(in_stack_fffffffffffffc8e,
                                                     CONCAT15(in_stack_fffffffffffffc8d,
                                                              in_stack_fffffffffffffc88))),
                                   CONCAT17(in_stack_fffffffffffffc9f,
                                            CONCAT16(in_stack_fffffffffffffc9e,
                                                     in_stack_fffffffffffffc98)),
                                   in_stack_fffffffffffffc90);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffc78,
               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    other.m_data._0_6_ = in_stack_fffffffffffffc98;
    other.m_size = in_stack_fffffffffffffc90;
    other.m_data._6_1_ = in_stack_fffffffffffffc9e;
    other.m_data._7_1_ = in_stack_fffffffffffffc9f;
    iVar2 = QLatin1String::compare(in_stack_fffffffffffffc68,other,CaseInsensitive);
    if (iVar2 == 0) {
      for (; qVar3 = QLatin1String::size(&local_230), local_2c8 < qVar3; local_2c8 = local_2c8 + 1)
      {
        local_249 = (char)QLatin1String::at((QLatin1String *)
                                            CONCAT17(in_stack_fffffffffffffc77,
                                                     in_stack_fffffffffffffc70),
                                            (qsizetype)in_stack_fffffffffffffc68);
        local_24a = 0x3f;
        bVar1 = operator==((QLatin1Char *)
                           CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                           (char *)in_stack_fffffffffffffc68);
        local_331 = false;
        if (bVar1) {
          qVar3 = QLatin1String::size(&local_230);
          local_331 = false;
          if (local_2c8 + 2 < qVar3) {
            local_24b = (char)QLatin1String::at((QLatin1String *)
                                                CONCAT17(in_stack_fffffffffffffc77,
                                                         in_stack_fffffffffffffc70),
                                                (qsizetype)in_stack_fffffffffffffc68);
            local_24c = 0x3e;
            local_331 = operator==((QLatin1Char *)
                                   CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                                   (char *)in_stack_fffffffffffffc68);
          }
        }
        if (local_331 != false) {
          local_2c8 = local_2c8 + 2;
          break;
        }
      }
      while( true ) {
        qVar3 = QLatin1String::size(&local_230);
        in_stack_fffffffffffffcbe.ucs = in_stack_fffffffffffffcbe.ucs & 0xff;
        if (local_2c8 < qVar3) {
          QLatin1String::at((QLatin1String *)
                            CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                            (qsizetype)in_stack_fffffffffffffc68);
          uVar6 = (undefined1)in_stack_fffffffffffffcbe.ucs;
          QChar::QChar<QLatin1Char,_true>
                    ((QChar *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                     (QLatin1Char)(char)((ulong)in_stack_fffffffffffffc78 >> 0x38));
          bVar1 = QChar::isSpace((QChar *)0x7bd2e9);
          in_stack_fffffffffffffcbe.ucs = CONCAT11(bVar1,uVar6);
        }
        if ((char)((ushort)in_stack_fffffffffffffcbe.ucs >> 8) == '\0') break;
        local_2c8 = local_2c8 + 1;
      }
    }
    local_260 = QLatin1String::mid((QLatin1String *)
                                   CONCAT17(in_stack_fffffffffffffc8f,
                                            CONCAT16(in_stack_fffffffffffffc8e,
                                                     CONCAT15(in_stack_fffffffffffffc8d,
                                                              in_stack_fffffffffffffc88))),
                                   CONCAT17(in_stack_fffffffffffffc9f,
                                            CONCAT16(in_stack_fffffffffffffc9e,
                                                     in_stack_fffffffffffffc98)),
                                   in_stack_fffffffffffffc90);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffc78,
               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    other_00.m_data._0_6_ = in_stack_fffffffffffffc98;
    other_00.m_size = in_stack_fffffffffffffc90;
    other_00.m_data._6_1_ = in_stack_fffffffffffffc9e;
    other_00.m_data._7_1_ = in_stack_fffffffffffffc9f;
    iVar2 = QLatin1String::compare(in_stack_fffffffffffffc68,other_00,CaseInsensitive);
    if (iVar2 == 0) {
      local_2b9 = true;
    }
    else {
      local_300 = local_2c8;
      while( true ) {
        qVar3 = QLatin1String::size(&local_230);
        local_351 = false;
        if (local_300 < qVar3) {
          local_261 = (char)QLatin1String::at((QLatin1String *)
                                              CONCAT17(in_stack_fffffffffffffc77,
                                                       in_stack_fffffffffffffc70),
                                              (qsizetype)in_stack_fffffffffffffc68);
          local_262 = 0x3c;
          bVar1 = operator!=((QLatin1Char *)
                             CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                             (char *)in_stack_fffffffffffffc68);
          local_351 = false;
          if (bVar1) {
            local_263 = (char)QLatin1String::at((QLatin1String *)
                                                CONCAT17(in_stack_fffffffffffffc77,
                                                         in_stack_fffffffffffffc70),
                                                (qsizetype)in_stack_fffffffffffffc68);
            local_264 = 10;
            local_351 = operator!=((QLatin1Char *)
                                   CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                                   (char *)in_stack_fffffffffffffc68);
          }
        }
        if (local_351 == false) {
          lVar5 = local_300;
          qVar3 = QLatin1String::size(&local_230);
          uVar6 = false;
          if (lVar5 < qVar3) {
            local_289 = (char)QLatin1String::at((QLatin1String *)
                                                CONCAT17(in_stack_fffffffffffffc77,
                                                         in_stack_fffffffffffffc70),
                                                (qsizetype)in_stack_fffffffffffffc68);
            local_28a = 0x3c;
            uVar6 = operator==((QLatin1Char *)
                               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                               (char *)in_stack_fffffffffffffc68);
          }
          if ((bool)uVar6 != false) {
            QChar::QChar<char16_t,_true>(&local_28c,L'>');
            qVar3 = QLatin1String::indexOf
                              ((QLatin1String *)
                               CONCAT17(in_stack_fffffffffffffc8f,
                                        CONCAT16(in_stack_fffffffffffffc8e,
                                                 CONCAT15(in_stack_fffffffffffffc8d,
                                                          in_stack_fffffffffffffc88))),
                               in_stack_fffffffffffffcbe,(qsizetype)in_stack_fffffffffffffc80,
                               (CaseSensitivity)((ulong)in_stack_fffffffffffffc78 >> 0x20));
            if (-1 < qVar3) {
              memset(&local_220,0xaa,0x218);
              QVarLengthArray<char16_t,_256LL>::QVarLengthArray(&local_220);
              goto LAB_007bd63b;
            }
          }
          local_2b9 = false;
          goto LAB_007bd8e1;
        }
        local_265 = (char)QLatin1String::at((QLatin1String *)
                                            CONCAT17(in_stack_fffffffffffffc77,
                                                     in_stack_fffffffffffffc70),
                                            (qsizetype)in_stack_fffffffffffffc68);
        local_266 = 0x26;
        bVar1 = operator==((QLatin1Char *)
                           CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                           (char *)in_stack_fffffffffffffc68);
        bVar4 = false;
        if (bVar1) {
          local_278 = QLatin1String::mid((QLatin1String *)
                                         CONCAT17(in_stack_fffffffffffffc8f,
                                                  CONCAT16(in_stack_fffffffffffffc8e,
                                                           CONCAT15(in_stack_fffffffffffffc8d,
                                                                    in_stack_fffffffffffffc88))),
                                         (ulong)CONCAT16(in_stack_fffffffffffffc9e,
                                                         in_stack_fffffffffffffc98),
                                         in_stack_fffffffffffffc90);
          local_288 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffffc78,
                                 CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
          bVar4 = operator==((QLatin1StringView *)
                             CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                             in_stack_fffffffffffffc68);
        }
        if (bVar4 != false) break;
        local_300 = local_300 + 1;
        in_stack_fffffffffffffc9f = 0;
      }
      local_2b9 = true;
    }
  }
  goto LAB_007bd8e1;
LAB_007bd63b:
  do {
    local_310 = local_300 + 1;
    if (qVar3 <= local_310) goto LAB_007bd83b;
    local_28e = 0xaaaa;
    QLatin1String::operator[](in_stack_fffffffffffffc68,0x7bd675);
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (QLatin1Char)(char)((ulong)in_stack_fffffffffffffc78 >> 0x38));
    bVar1 = QChar::isDigit((QChar *)0x7bd69e);
    if ((bVar1) || (bVar1 = QChar::isLetter((QChar *)0x7bd6af), bVar1)) {
      local_290 = QChar::toLower((QChar *)CONCAT17(in_stack_fffffffffffffc77,
                                                   in_stack_fffffffffffffc70));
      QChar::unicode(&local_290);
      QVarLengthArray<char16_t,_256LL>::append(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      local_300 = local_310;
      goto LAB_007bd63b;
    }
    bVar1 = QVarLengthArray<char16_t,_256LL>::isEmpty((QVarLengthArray<char16_t,_256LL> *)0x7bd6f9);
    if ((!bVar1) && (bVar1 = QChar::isSpace((QChar *)0x7bd70a), bVar1)) {
LAB_007bd83b:
      str = local_2a8;
      this = (QStringView *)
             std::data<QVarLengthArray<char16_t,256ll>>
                       ((QVarLengthArray<char16_t,_256LL> *)0x7bd875);
      QtPrivate::lengthHelperContainer<QVarLengthArray<char16_t,256ll>>
                ((QVarLengthArray<char16_t,_256LL> *)0x7bd887);
      QStringView::QStringView<char16_t,_true>
                (this,str,CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
      element.m_data._0_6_ = in_stack_fffffffffffffc98;
      element.m_size = lVar5;
      element.m_data._6_1_ = uVar6;
      element.m_data._7_1_ = in_stack_fffffffffffffc9f;
      iVar2 = QTextHtmlParser::lookupElement(element);
      local_2b9 = iVar2 != -1;
      goto LAB_007bd8c8;
    }
    bVar1 = QVarLengthArray<char16_t,_256LL>::isEmpty((QVarLengthArray<char16_t,_256LL> *)0x7bd722);
    bVar4 = false;
    if (!bVar1) {
      QChar::QChar<char16_t,_true>(&local_292,L'/');
      bVar1 = operator==((QChar *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                         (QChar *)in_stack_fffffffffffffc68);
      bVar4 = false;
      if (bVar1) {
        bVar4 = local_300 + 2 == qVar3;
      }
    }
    if (bVar4) goto LAB_007bd83b;
    bVar1 = QChar::isSpace((QChar *)0x7bd79c);
    bVar4 = false;
    if (!bVar1) {
      bVar1 = QVarLengthArray<char16_t,_256LL>::isEmpty
                        ((QVarLengthArray<char16_t,_256LL> *)0x7bd7b6);
      bVar4 = true;
      if (bVar1) {
        QChar::QChar<char16_t,_true>(&local_294,L'!');
        bVar4 = operator!=((QChar *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
                           (QChar *)in_stack_fffffffffffffc68);
      }
    }
    local_300 = local_310;
  } while (bVar4 == false);
  local_2b9 = false;
LAB_007bd8c8:
  QVarLengthArray<char16_t,_256LL>::~QVarLengthArray
            ((QVarLengthArray<char16_t,_256LL> *)
             CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
LAB_007bd8e1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2b9;
}

Assistant:

static bool mightBeRichTextImpl(T text)
{
    if (text.isEmpty())
        return false;
    qsizetype start = 0;

    while (start < text.size() && QChar(text.at(start)).isSpace())
        ++start;

    // skip a leading <?xml ... ?> as for example with xhtml
    if (text.mid(start, 5).compare("<?xml"_L1) == 0) {
        while (start < text.size()) {
            if (text.at(start) == u'?'
                && start + 2 < text.size()
                && text.at(start + 1) == u'>') {
                start += 2;
                break;
            }
            ++start;
        }

        while (start < text.size() && QChar(text.at(start)).isSpace())
            ++start;
    }

    if (text.mid(start, 5).compare("<!doc"_L1, Qt::CaseInsensitive) == 0)
        return true;
    qsizetype open = start;
    while (open < text.size() && text.at(open) != u'<'
            && text.at(open) != u'\n') {
        if (text.at(open) == u'&' && text.mid(open + 1, 3) == "lt;"_L1)
            return true; // support desperate attempt of user to see <...>
        ++open;
    }
    if (open < text.size() && text.at(open) == u'<') {
        const qsizetype close = text.indexOf(u'>', open);
        if (close > -1) {
            QVarLengthArray<char16_t> tag;
            for (qsizetype i = open + 1; i < close; ++i) {
                const auto current = QChar(text[i]);
                if (current.isDigit() || current.isLetter())
                    tag.append(current.toLower().unicode());
                else if (!tag.isEmpty() && current.isSpace())
                    break;
                else if (!tag.isEmpty() && current == u'/' && i + 1 == close)
                    break;
                else if (!current.isSpace() && (!tag.isEmpty() || current != u'!'))
                    return false; // that's not a tag
            }
#ifndef QT_NO_TEXTHTMLPARSER
            return QTextHtmlParser::lookupElement(tag) != -1;
#else
            return false;
#endif // QT_NO_TEXTHTMLPARSER
        }
    }
    return false;
}